

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O0

void __thiscall mocker::ast::ClassDecl::~ClassDecl(ClassDecl *this)

{
  ClassDecl *this_local;
  
  (this->super_Declaration).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__ClassDecl_0039e790;
  std::
  vector<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
  ::~vector(&this->members);
  std::shared_ptr<mocker::ast::Identifier>::~shared_ptr(&this->identifier);
  Declaration::~Declaration(&this->super_Declaration);
  return;
}

Assistant:

ClassDecl(std::shared_ptr<Identifier> identifier,
            std::vector<std::shared_ptr<Declaration>> members)
      : identifier(std::move(identifier)), members(std::move(members)) {}